

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

void __thiscall deci::ast_for_t::~ast_for_t(ast_for_t *this)

{
  ast_t *this_00;
  ast_for_t *this_local;
  
  if (this->start != (ast_item_t *)0x0) {
    (*this->start->_vptr_ast_item_t[4])();
  }
  if (this->finish != (ast_item_t *)0x0) {
    (*this->finish->_vptr_ast_item_t[4])();
  }
  this_00 = this->loop;
  if (this_00 != (ast_t *)0x0) {
    ast_t::~ast_t(this_00);
    operator_delete(this_00);
  }
  if (this->step != (ast_item_t *)0x0) {
    (*this->step->_vptr_ast_item_t[4])();
  }
  std::__cxx11::string::~string((string *)&this->identifier);
  ast_loop_t::~ast_loop_t(&this->super_ast_loop_t);
  return;
}

Assistant:

ast_for_t::~ast_for_t() {
    delete this->start;
    delete this->finish;
    delete this->loop;
    delete this->step;
  }